

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  LogMessage *other;
  pointer pUVar2;
  pointer pUVar3;
  long lVar4;
  long lVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  pvVar1 = this->fields_;
  if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    pUVar3 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pUVar2 != pUVar3) goto LAB_00338304;
  }
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
             ,0x4a);
  other = internal::LogMessage::operator<<
                    (&local_50,"CHECK failed: fields_ != NULL && fields_->size() > 0: ");
  internal::LogFinisher::operator=(&local_51,other);
  internal::LogMessage::~LogMessage(&local_50);
  pUVar3 = (this->fields_->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->fields_->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
LAB_00338304:
  lVar4 = (long)(int)((ulong)((long)pUVar2 - (long)pUVar3) >> 4);
  lVar5 = lVar4 + 1;
  lVar4 = lVar4 << 4;
  do {
    UnknownField::Delete
              ((UnknownField *)
               ((long)&(this->fields_->
                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       )._M_impl.super__Vector_impl_data._M_start[-1].number_ + lVar4));
    lVar5 = lVar5 + -1;
    lVar4 = lVar4 + -0x10;
  } while (1 < lVar5);
  pvVar1 = this->fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     (pUVar3 = (pvVar1->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start, pUVar3 != (pointer)0x0)) {
    operator_delete(pUVar3,(long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar3)
    ;
  }
  operator_delete(pvVar1,0x18);
  this->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(fields_ != NULL && fields_->size() > 0);
  int n = fields_->size();
  do {
    (*fields_)[--n].Delete();
  } while (n > 0);
  delete fields_;
  fields_ = NULL;
}